

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  uint uVar1;
  UninterpretedOption *pUVar2;
  EnumDescriptor *this_00;
  DescriptorPool *pDVar3;
  long lVar4;
  ulong uVar5;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  bool bVar7;
  int iVar8;
  Type type;
  long *plVar9;
  DescriptorPool *pDVar10;
  string *psVar12;
  anon_union_8_8_13f84498_for_Symbol_2 aVar13;
  FieldDescriptor *extraout_RAX;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int32 value_00;
  uint64 uVar16;
  OptionInterpreter *pOVar17;
  float value_01;
  Symbol SVar18;
  undefined1 local_128 [32];
  UnknownFieldSet *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  OptionInterpreter *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string fully_qualified_name;
  FieldDescriptor *pFVar11;
  
  if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
    local_50 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
    local_70._M_dataplus._M_p = (pointer)option_field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(option_field + 0x30),(_func_void_FieldDescriptor_ptr **)local_50,
               (FieldDescriptor **)&local_70);
  }
  switch(*(undefined4 *)
          (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(option_field + 0x38) * 4)) {
  case 1:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) == 0) {
        std::operator+(&local_70,"Value must be integer for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
        pFVar11 = (FieldDescriptor *)(plVar9 + 2);
        if ((FieldDescriptor *)*plVar9 == pFVar11) {
          fully_qualified_name._M_string_length = *(size_type *)pFVar11;
          fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
        }
        else {
          fully_qualified_name._M_string_length = *(size_type *)pFVar11;
          local_50 = (undefined1  [8])*plVar9;
        }
        fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
        *plVar9 = (long)pFVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
      }
      else {
        lVar4 = pUVar2->negative_int_value_;
        if (-0x80000001 < lVar4) {
          iVar8 = *(int *)(option_field + 0x44);
          type = FieldDescriptor::type(option_field);
          value_00 = (int32)lVar4;
          pOVar17 = (OptionInterpreter *)option_field;
          goto LAB_00286f50;
        }
        std::operator+(&local_70,"Value out of range for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
        pFVar11 = (FieldDescriptor *)(plVar9 + 2);
        if ((FieldDescriptor *)*plVar9 == pFVar11) {
          fully_qualified_name._M_string_length = *(size_type *)pFVar11;
          fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
        }
        else {
          fully_qualified_name._M_string_length = *(size_type *)pFVar11;
          local_50 = (undefined1  [8])*plVar9;
        }
        fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
        *plVar9 = (long)pFVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
      }
    }
    else {
      uVar5 = pUVar2->positive_int_value_;
      if ((uVar5 & 0xffffffff80000000) == 0) {
        iVar8 = *(int *)(option_field + 0x44);
        pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
        if (pOVar17 != (OptionInterpreter *)0x0) {
          local_50 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
          local_70._M_dataplus._M_p = (pointer)option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)local_50,
                     (FieldDescriptor **)&local_70);
        }
        type = *(Type *)(option_field + 0x38);
        value_00 = (int32)uVar5;
LAB_00286f50:
        SetInt32(pOVar17,iVar8,value_00,type,unknown_fields);
        return true;
      }
      std::operator+(&local_70,"Value out of range for int32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
      pFVar11 = (FieldDescriptor *)(plVar9 + 2);
      if ((FieldDescriptor *)*plVar9 == pFVar11) {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
      }
      else {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        local_50 = (undefined1  [8])*plVar9;
      }
      fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pFVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    }
    break;
  case 2:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) != 0) {
        iVar8 = *(int *)(option_field + 0x44);
        uVar16 = pUVar2->negative_int_value_;
LAB_00286cdc:
        pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
        if (pOVar17 != (OptionInterpreter *)0x0) {
          local_50 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
          local_70._M_dataplus._M_p = (pointer)option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)local_50,
                     (FieldDescriptor **)&local_70);
        }
        SetInt64(pOVar17,iVar8,uVar16,*(Type *)(option_field + 0x38),unknown_fields);
        return true;
      }
      std::operator+(&local_70,"Value must be integer for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
      pFVar11 = (FieldDescriptor *)(plVar9 + 2);
      if ((FieldDescriptor *)*plVar9 == pFVar11) {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
      }
      else {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        local_50 = (undefined1  [8])*plVar9;
      }
      fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pFVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    }
    else {
      uVar16 = pUVar2->positive_int_value_;
      if (-1 < (long)uVar16) {
        iVar8 = *(int *)(option_field + 0x44);
        goto LAB_00286cdc;
      }
      std::operator+(&local_70,"Value out of range for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
      pFVar11 = (FieldDescriptor *)(plVar9 + 2);
      if ((FieldDescriptor *)*plVar9 == pFVar11) {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
      }
      else {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        local_50 = (undefined1  [8])*plVar9;
      }
      fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pFVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    }
    break;
  case 3:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) == 0) {
      std::operator+(&local_70,"Value must be non-negative integer for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
      pFVar11 = (FieldDescriptor *)(plVar9 + 2);
      if ((FieldDescriptor *)*plVar9 == pFVar11) {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
      }
      else {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        local_50 = (undefined1  [8])*plVar9;
      }
      fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pFVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    }
    else {
      uVar5 = this->uninterpreted_option_->positive_int_value_;
      if (uVar5 >> 0x20 == 0) {
        iVar8 = *(int *)(option_field + 0x44);
        pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
        if (pOVar17 != (OptionInterpreter *)0x0) {
          local_50 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
          local_70._M_dataplus._M_p = (pointer)option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)local_50,
                     (FieldDescriptor **)&local_70);
        }
        SetUInt32(pOVar17,iVar8,(uint32)uVar5,*(Type *)(option_field + 0x38),unknown_fields);
        return true;
      }
      std::operator+(&local_70,"Value out of range for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
      pFVar11 = (FieldDescriptor *)(plVar9 + 2);
      if ((FieldDescriptor *)*plVar9 == pFVar11) {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
      }
      else {
        fully_qualified_name._M_string_length = *(size_type *)pFVar11;
        local_50 = (undefined1  [8])*plVar9;
      }
      fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pFVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    }
    break;
  case 4:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) != 0) {
      iVar8 = *(int *)(option_field + 0x44);
      uVar16 = this->uninterpreted_option_->positive_int_value_;
      pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
      if (pOVar17 != (OptionInterpreter *)0x0) {
        local_50 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
        local_70._M_dataplus._M_p = (pointer)option_field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)local_50,
                   (FieldDescriptor **)&local_70);
      }
      SetUInt64(pOVar17,iVar8,uVar16,*(Type *)(option_field + 0x38),unknown_fields);
      return true;
    }
    std::operator+(&local_70,"Value must be non-negative integer for uint64 option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
    pFVar11 = (FieldDescriptor *)(plVar9 + 2);
    if ((FieldDescriptor *)*plVar9 == pFVar11) {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
    }
    else {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      local_50 = (undefined1  [8])*plVar9;
    }
    fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
    *plVar9 = (long)pFVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    break;
  case 5:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) != 0) {
      value = pUVar2->double_value_;
LAB_00286f27:
      UnknownFieldSet::AddFixed64(unknown_fields,*(int *)(option_field + 0x44),(uint64)value);
      return true;
    }
    if ((uVar1 & 8) != 0) {
      value = ((double)CONCAT44(0x45300000,(int)(pUVar2->positive_int_value_ >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)pUVar2->positive_int_value_) - 4503599627370496.0);
      goto LAB_00286f27;
    }
    if ((uVar1 & 0x10) != 0) {
      value = (double)pUVar2->negative_int_value_;
      goto LAB_00286f27;
    }
    std::operator+(&local_70,"Value must be number for double option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
    pFVar11 = (FieldDescriptor *)(plVar9 + 2);
    if ((FieldDescriptor *)*plVar9 == pFVar11) {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
    }
    else {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      local_50 = (undefined1  [8])*plVar9;
    }
    fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
    *plVar9 = (long)pFVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    break;
  case 6:
    pUVar2 = this->uninterpreted_option_;
    uVar1 = (pUVar2->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) != 0) {
      value_01 = (float)pUVar2->double_value_;
LAB_00286b50:
      UnknownFieldSet::AddFixed32(unknown_fields,*(int *)(option_field + 0x44),(uint32)value_01);
      return true;
    }
    if ((uVar1 & 8) != 0) {
      uVar5 = pUVar2->positive_int_value_;
      if ((long)uVar5 < 0) {
        value_01 = (float)uVar5;
      }
      else {
        value_01 = (float)(long)uVar5;
      }
      goto LAB_00286b50;
    }
    if ((uVar1 & 0x10) != 0) {
      value_01 = (float)pUVar2->negative_int_value_;
      goto LAB_00286b50;
    }
    std::operator+(&local_70,"Value must be number for float option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
    pFVar11 = (FieldDescriptor *)(plVar9 + 2);
    if ((FieldDescriptor *)*plVar9 == pFVar11) {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
    }
    else {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      local_50 = (undefined1  [8])*plVar9;
    }
    fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
    *plVar9 = (long)pFVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    break;
  case 7:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 1) != 0) {
      iVar8 = std::__cxx11::string::compare
                        ((char *)(this->uninterpreted_option_->identifier_value_).ptr_);
      if (iVar8 == 0) {
        uVar16 = 1;
      }
      else {
        iVar8 = std::__cxx11::string::compare
                          ((char *)(this->uninterpreted_option_->identifier_value_).ptr_);
        if (iVar8 != 0) {
          std::operator+(&local_70,"Value must be \"true\" or \"false\" for boolean option \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
          pFVar11 = (FieldDescriptor *)(plVar9 + 2);
          if ((FieldDescriptor *)*plVar9 == pFVar11) {
            fully_qualified_name._M_string_length = *(size_type *)pFVar11;
            fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
          }
          else {
            fully_qualified_name._M_string_length = *(size_type *)pFVar11;
            local_50 = (undefined1  [8])*plVar9;
          }
          fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
          *plVar9 = (long)pFVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
          break;
        }
        uVar16 = 0;
      }
      iVar8 = *(int *)(option_field + 0x44);
LAB_002873d8:
      UnknownFieldSet::AddVarint(unknown_fields,iVar8,uVar16);
LAB_002873df:
      return true;
    }
    std::operator+(&local_70,"Value must be identifier for boolean option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
    pFVar11 = (FieldDescriptor *)(plVar9 + 2);
    if ((FieldDescriptor *)*plVar9 == pFVar11) {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
    }
    else {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      local_50 = (undefined1  [8])*plVar9;
    }
    fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
    *plVar9 = (long)pFVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    break;
  case 8:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 1) != 0) {
      local_108 = unknown_fields;
      if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
        local_50 = (undefined1  [8])option_field;
        std::
        call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(option_field + 0x30),FieldDescriptor::TypeOnceInit,
                   (FieldDescriptor **)local_50);
      }
      this_00 = *(EnumDescriptor **)(option_field + 0x70);
      psVar12 = (this->uninterpreted_option_->identifier_value_).ptr_;
      pDVar3 = *(DescriptorPool **)(*(long *)(this_00 + 0x10) + 0x10);
      local_80 = this;
      pDVar10 = DescriptorPool::internal_generated_pool();
      internal::AssignDescriptors(&descriptor_table_google_2fprotobuf_2fdescriptor_2eproto,false);
      if (pDVar3 == pDVar10) {
        aVar13.enum_value_descriptor = EnumDescriptor::FindValueByName(this_00,psVar12);
      }
      else {
        lVar4 = **(long **)(this_00 + 8);
        local_78 = psVar12;
        local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,lVar4,(*(long **)(this_00 + 8))[1] + lVar4);
        std::__cxx11::string::resize
                  ((ulong)local_50,
                   (char)fully_qualified_name._M_dataplus._M_p -
                   (char)*(undefined8 *)(*(long *)this_00 + 8));
        std::__cxx11::string::_M_append(local_50,(ulong)(local_78->_M_dataplus)._M_p);
        SVar18 = FindSymbolNotEnforcingDeps(local_80->builder_,(string *)local_50,true);
        pFVar11 = SVar18._0_8_;
        bVar7 = true;
        if (SVar18.type == ENUM_VALUE) {
          if (*(EnumDescriptor **)(SVar18.field_1.descriptor + 0x18) != this_00) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128,"Enum type \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (this_00 + 8));
            plVar9 = (long *)std::__cxx11::string::append(local_128);
            psVar14 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_100.field_2._M_allocated_capacity = *psVar14;
              local_100.field_2._8_8_ = plVar9[3];
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar14;
              local_100._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_100._M_string_length = plVar9[1];
            *plVar9 = (long)psVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::operator+(&local_c0,&local_100,local_78);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar14 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_a0.field_2._M_allocated_capacity = *psVar14;
              local_a0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar14;
              local_a0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_a0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::operator+(&local_e0,&local_a0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (option_field + 8));
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar15) {
              local_70.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_70.field_2._8_8_ = plVar9[3];
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            }
            else {
              local_70.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_70._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_70._M_string_length = plVar9[1];
            *plVar9 = (long)paVar15;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            AddError(local_80->builder_,&local_80->options_to_interpret_->element_name,
                     &local_80->uninterpreted_option_->super_Message,OPTION_VALUE,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            pFVar11 = (FieldDescriptor *)(local_128 + 0x10);
            if ((FieldDescriptor *)local_128._0_8_ != pFVar11) {
              operator_delete((void *)local_128._0_8_);
              pFVar11 = extraout_RAX;
            }
            bVar7 = false;
            goto LAB_002873a6;
          }
        }
        else {
LAB_002873a6:
          SVar18.field_1.descriptor = (Descriptor *)0x0;
          SVar18._0_8_ = pFVar11;
        }
        aVar13 = SVar18.field_1;
        if (local_50 != (undefined1  [8])&fully_qualified_name._M_string_length) {
          operator_delete((void *)local_50);
        }
        psVar12 = local_78;
        if (!bVar7) {
          return false;
        }
      }
      if (aVar13.descriptor == (Descriptor *)0x0) {
        if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
          local_128._0_8_ = option_field;
          std::
          call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(option_field + 0x30),FieldDescriptor::TypeOnceInit,
                     (FieldDescriptor **)local_128);
        }
        std::operator+(&local_100,"Enum type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(option_field + 0x70) + 8));
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
        psVar14 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_c0.field_2._M_allocated_capacity = *psVar14;
          local_c0.field_2._8_8_ = plVar9[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar14;
          local_c0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_c0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::operator+(&local_a0,&local_c0,psVar12);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_a0);
        pOVar17 = local_80;
        psVar14 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_e0.field_2._M_allocated_capacity = *psVar14;
          local_e0.field_2._8_8_ = plVar9[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar14;
          local_e0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_e0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::operator+(&local_70,&local_e0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
        pFVar11 = (FieldDescriptor *)(plVar9 + 2);
        if ((FieldDescriptor *)*plVar9 == pFVar11) {
          fully_qualified_name._M_string_length = *(size_type *)pFVar11;
          fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
          local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
        }
        else {
          fully_qualified_name._M_string_length = *(size_type *)pFVar11;
          local_50 = (undefined1  [8])*plVar9;
        }
        fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
        *plVar9 = (long)pFVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        AddError(pOVar17->builder_,&pOVar17->options_to_interpret_->element_name,
                 &pOVar17->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
        if (local_50 != (undefined1  [8])&fully_qualified_name._M_string_length) {
          operator_delete((void *)local_50);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        pbVar6 = &local_100;
        goto LAB_002871f2;
      }
      iVar8 = *(int *)(option_field + 0x44);
      uVar16 = (uint64)*(int *)(aVar13.descriptor + 0x10);
      unknown_fields = local_108;
      goto LAB_002873d8;
    }
    std::operator+(&local_70,"Value must be identifier for enum-valued option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
    pFVar11 = (FieldDescriptor *)(plVar9 + 2);
    if ((FieldDescriptor *)*plVar9 == pFVar11) {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
    }
    else {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      local_50 = (undefined1  [8])*plVar9;
    }
    fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
    *plVar9 = (long)pFVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    break;
  case 9:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 2) != 0) {
      psVar12 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                          (unknown_fields,*(int *)(option_field + 0x44));
      std::__cxx11::string::_M_assign((string *)psVar12);
      return true;
    }
    std::operator+(&local_70,"Value must be quoted string for string option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (undefined1  [8])&fully_qualified_name._M_string_length;
    pFVar11 = (FieldDescriptor *)(plVar9 + 2);
    if ((FieldDescriptor *)*plVar9 == pFVar11) {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      fully_qualified_name.field_2._M_allocated_capacity = plVar9[3];
    }
    else {
      fully_qualified_name._M_string_length = *(size_type *)pFVar11;
      local_50 = (undefined1  [8])*plVar9;
    }
    fully_qualified_name._M_dataplus._M_p = (pointer)plVar9[1];
    *plVar9 = (long)pFVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_50);
    break;
  case 10:
    bVar7 = SetAggregateOption(this,option_field,unknown_fields);
    if (!bVar7) {
      return false;
    }
    return true;
  default:
    goto LAB_002873df;
  }
  if (local_50 != (undefined1  [8])&fully_qualified_name._M_string_length) {
    operator_delete((void *)local_50);
  }
  pbVar6 = &local_70;
LAB_002871f2:
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&(pbVar6->field_2)._M_allocated_capacity)[-2];
  if (paVar15 != &pbVar6->field_2) {
    operator_delete(paVar15);
  }
  return false;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint32max)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64>(kint32min)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be integer for int32 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint64max)) {
          return AddValueError("Value out of range for int64 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be integer for int64 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() > kuint32max) {
          return AddValueError("Value out of range for uint32 option \"" +
                               option_field->name() + "\".");
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError(
            "Value must be non-negative integer for uint32 "
            "option \"" +
            option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError(
            "Value must be non-negative integer for uint64 "
            "option \"" +
            option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for float option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for double option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64 value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError(
            "Value must be identifier for boolean option "
            "\"" +
            option_field->full_name() + "\".");
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError(
            "Value must be \"true\" or \"false\" for boolean "
            "option \"" +
            option_field->full_name() + "\".");
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError(
            "Value must be identifier for enum-valued option "
            "\"" +
            option_field->full_name() + "\".");
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = enum_type->full_name();
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (!symbol.IsNull() && symbol.type == Symbol::ENUM_VALUE) {
          if (symbol.enum_value_descriptor->type() != enum_type) {
            return AddValueError(
                "Enum type \"" + enum_type->full_name() +
                "\" has no value named \"" + value_name + "\" for option \"" +
                option_field->full_name() +
                "\". This appears to be a value from a sibling type.");
          } else {
            enum_value = symbol.enum_value_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError("Enum type \"" +
                             option_field->enum_type()->full_name() +
                             "\" has no value named \"" + value_name +
                             "\" for "
                             "option \"" +
                             option_field->full_name() + "\".");
      } else {
        // Sign-extension is not a problem, since we cast directly from int32 to
        // uint64, without first going through uint32.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64>(static_cast<int64>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError(
            "Value must be quoted string for string option "
            "\"" +
            option_field->full_name() + "\".");
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}